

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOAnimation.cpp
# Opt level: O3

void __thiscall Assimp::LWO::AnimResolver::ExtractBindPose(AnimResolver *this,aiMatrix4x4 *out)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  
  if ((((_List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *)
       &((_List_node_base *)this->envelopes)->_M_next)->_M_impl)._M_node.super__List_node_base.
      _M_next == (_List_node_base *)this->envelopes) {
    out->a1 = 1.0;
    out->a2 = 0.0;
    out->a3 = 0.0;
    out->a4 = 0.0;
    out->b1 = 0.0;
    out->b2 = 1.0;
    out->b3 = 0.0;
    out->b4 = 0.0;
    out->c1 = 0.0;
    out->c2 = 0.0;
    out->c3 = 1.0;
    out->c4 = 0.0;
    out->d1 = 0.0;
    out->d2 = 0.0;
    out->d3 = 0.0;
    fVar1 = 1.0;
  }
  else {
    fVar8 = 0.0;
    fVar1 = 0.0;
    if (this->trans_x != (Envelope *)0x0) {
      fVar1 = ((this->trans_x->keys).
               super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
               super__Vector_impl_data._M_start)->value;
    }
    if (this->trans_y != (Envelope *)0x0) {
      fVar8 = ((this->trans_y->keys).
               super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
               super__Vector_impl_data._M_start)->value;
    }
    fVar10 = 0.0;
    fVar18 = 0.0;
    if (this->trans_z != (Envelope *)0x0) {
      fVar18 = ((this->trans_z->keys).
                super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
                super__Vector_impl_data._M_start)->value;
    }
    if (this->rotat_x != (Envelope *)0x0) {
      fVar10 = ((this->rotat_x->keys).
                super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
                super__Vector_impl_data._M_start)->value;
    }
    fVar2 = 0.0;
    fVar12 = 0.0;
    if (this->rotat_y != (Envelope *)0x0) {
      fVar12 = ((this->rotat_y->keys).
                super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
                super__Vector_impl_data._M_start)->value;
    }
    if (this->rotat_z != (Envelope *)0x0) {
      fVar2 = ((this->rotat_z->keys).
               super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
               super__Vector_impl_data._M_start)->value;
    }
    fVar11 = 1.0;
    if (this->scale_x != (Envelope *)0x0) {
      fVar11 = ((this->scale_x->keys).
                super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
                super__Vector_impl_data._M_start)->value;
    }
    fVar13 = 1.0;
    if (this->scale_y != (Envelope *)0x0) {
      fVar13 = ((this->scale_y->keys).
                super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
                super__Vector_impl_data._M_start)->value;
    }
    fVar9 = 1.0;
    if (this->scale_z != (Envelope *)0x0) {
      fVar9 = ((this->scale_z->keys).
               super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
               super__Vector_impl_data._M_start)->value;
    }
    fVar3 = cosf(fVar2);
    fVar2 = sinf(fVar2);
    fVar4 = cosf(fVar12);
    fVar12 = sinf(fVar12);
    fVar5 = cosf(fVar10);
    fVar10 = sinf(fVar10);
    fVar14 = fVar5 * 0.0;
    fVar17 = fVar10 * -0.0 + fVar14 + 0.0;
    fVar6 = fVar10 * 0.0 + 0.0;
    fVar15 = fVar14 + fVar6;
    fVar7 = fVar1 * 0.0;
    fVar21 = fVar5 + 0.0 + fVar10 * -0.0 + fVar7;
    fVar24 = fVar10 + 0.0 + fVar14 + fVar7;
    fVar7 = fVar7 + 0.0;
    fVar22 = fVar21 * 0.0;
    fVar1 = fVar1 + 0.0;
    fVar21 = fVar7 * 0.0 + fVar21 + fVar24 * 0.0 + fVar1 * 0.0;
    fVar31 = fVar12 * fVar24 + fVar7 * fVar4 + fVar22 + fVar1 * 0.0;
    fVar30 = fVar8 * 0.0;
    fVar26 = fVar30 + fVar17;
    fVar20 = fVar30 + 1.0;
    fVar30 = fVar30 + fVar15;
    fVar27 = fVar26 * 0.0;
    fVar8 = fVar8 + 0.0;
    fVar26 = fVar20 * 0.0 + fVar26 + fVar30 * 0.0 + fVar8 * 0.0;
    fVar16 = fVar12 * fVar30 + fVar20 * fVar4 + fVar27 + fVar8 * 0.0;
    fVar28 = fVar18 * 0.0;
    fVar14 = ((fVar14 + 0.0) - fVar10) + fVar28;
    fVar10 = fVar6 + fVar5 + fVar28;
    fVar28 = fVar28 + 0.0;
    fVar25 = fVar14 * 0.0;
    fVar18 = fVar18 + 0.0;
    fVar5 = fVar28 * 0.0 + fVar14 + fVar10 * 0.0 + fVar18 * 0.0;
    fVar6 = fVar12 * fVar10 + fVar28 * fVar4 + fVar25 + fVar18 * 0.0;
    fVar17 = fVar17 + 0.0;
    fVar15 = fVar15 + 0.0;
    fVar14 = fVar17 * 0.0;
    fVar19 = fVar14 + 0.0 + fVar15 * 0.0 + 1.0;
    fVar23 = fVar22 + fVar7 * 0.0 + fVar24 * 0.0 + fVar1;
    fVar7 = fVar1 * 0.0 + fVar24 * fVar4 + (fVar22 - fVar7 * fVar12);
    fVar32 = fVar21 * 0.0 + fVar31 * 0.0;
    fVar1 = fVar7 * 0.0;
    fVar22 = fVar32 + fVar1 + fVar23;
    fVar23 = fVar23 * 0.0;
    fVar24 = fVar3 * fVar21 + fVar2 * fVar31 + fVar1 + fVar23;
    fVar29 = (fVar3 * fVar31 - fVar2 * fVar21) + fVar1 + fVar23;
    fVar23 = fVar7 + fVar32 + fVar23;
    fVar31 = fVar27 + fVar20 * 0.0 + fVar30 * 0.0 + fVar8;
    fVar8 = fVar8 * 0.0 + fVar30 * fVar4 + (fVar27 - fVar20 * fVar12);
    fVar21 = fVar26 * 0.0 + fVar16 * 0.0;
    fVar1 = fVar8 * 0.0;
    fVar7 = fVar21 + fVar1 + fVar31;
    fVar31 = fVar31 * 0.0;
    fVar20 = fVar3 * fVar26 + fVar2 * fVar16 + fVar1 + fVar31;
    fVar27 = (fVar3 * fVar16 - fVar2 * fVar26) + fVar1 + fVar31;
    fVar31 = fVar8 + fVar21 + fVar31;
    fVar21 = fVar25 + fVar28 * 0.0 + fVar10 * 0.0 + fVar18;
    fVar8 = fVar18 * 0.0 + fVar10 * fVar4 + (fVar25 - fVar28 * fVar12);
    fVar10 = fVar5 * 0.0 + fVar6 * 0.0;
    fVar1 = fVar8 * 0.0;
    fVar18 = fVar10 + fVar1 + fVar21;
    fVar21 = fVar21 * 0.0;
    fVar26 = fVar3 * fVar5 + fVar2 * fVar6 + fVar1 + fVar21;
    fVar16 = (fVar3 * fVar6 - fVar2 * fVar5) + fVar1 + fVar21;
    fVar21 = fVar8 + fVar10 + fVar21;
    fVar5 = fVar15 * 0.0 + fVar17 + 0.0;
    fVar17 = fVar12 * fVar15 + fVar4 * 0.0 + fVar14 + 0.0;
    fVar6 = fVar5 * 0.0 + fVar17 * 0.0;
    fVar12 = fVar15 * fVar4 + fVar12 * -0.0 + fVar14 + 0.0;
    fVar1 = fVar12 * 0.0;
    fVar10 = fVar6 + fVar1 + fVar19;
    fVar19 = fVar19 * 0.0;
    fVar8 = fVar3 * fVar5 + fVar2 * fVar17 + fVar1 + fVar19;
    fVar2 = (fVar3 * fVar17 - fVar2 * fVar5) + fVar1 + fVar19;
    fVar19 = fVar12 + fVar6 + fVar19;
    fVar12 = fVar29 * 0.0;
    fVar3 = fVar23 * 0.0;
    fVar1 = fVar24 * 0.0 + fVar12;
    fVar4 = fVar22 * 0.0;
    out->a1 = fVar4 + fVar3 + fVar24 * fVar11 + fVar12;
    out->a2 = fVar4 + fVar3 + fVar24 * 0.0 + fVar29 * fVar13;
    out->a3 = fVar9 * fVar23 + fVar1 + fVar4;
    out->a4 = fVar1 + fVar3 + fVar22;
    fVar12 = fVar27 * 0.0;
    fVar3 = fVar31 * 0.0;
    fVar1 = fVar20 * 0.0 + fVar12;
    fVar4 = fVar7 * 0.0;
    out->b1 = fVar4 + fVar3 + fVar20 * fVar11 + fVar12;
    out->b2 = fVar4 + fVar3 + fVar20 * 0.0 + fVar27 * fVar13;
    out->b3 = fVar9 * fVar31 + fVar1 + fVar4;
    out->b4 = fVar1 + fVar3 + fVar7;
    fVar4 = fVar16 * 0.0;
    fVar1 = fVar21 * 0.0;
    fVar3 = fVar26 * 0.0 + fVar4;
    fVar12 = fVar18 * 0.0;
    out->c1 = fVar12 + fVar1 + fVar26 * fVar11 + fVar4;
    out->c2 = fVar12 + fVar1 + fVar26 * 0.0 + fVar16 * fVar13;
    out->c3 = fVar9 * fVar21 + fVar3 + fVar12;
    out->c4 = fVar3 + fVar1 + fVar18;
    fVar12 = fVar2 * 0.0;
    fVar18 = fVar8 * 0.0 + fVar12;
    fVar3 = fVar19 * 0.0;
    fVar1 = fVar18 + fVar3 + fVar10;
    fVar10 = fVar10 * 0.0;
    out->d1 = fVar10 + fVar3 + fVar8 * fVar11 + fVar12;
    out->d2 = fVar10 + fVar3 + fVar8 * 0.0 + fVar2 * fVar13;
    out->d3 = fVar9 * fVar19 + fVar18 + fVar10;
  }
  out->d4 = fVar1;
  return;
}

Assistant:

void AnimResolver::ExtractBindPose(aiMatrix4x4& out)
{
    // If we have no envelopes, return identity
    if (envelopes.empty()) {
        out = aiMatrix4x4();
        return;
    }
    aiVector3D angles, scaling(1.f,1.f,1.f), translation;

    if (trans_x) translation.x = trans_x->keys[0].value;
    if (trans_y) translation.y = trans_y->keys[0].value;
    if (trans_z) translation.z = trans_z->keys[0].value;

    if (rotat_x) angles.x = rotat_x->keys[0].value;
    if (rotat_y) angles.y = rotat_y->keys[0].value;
    if (rotat_z) angles.z = rotat_z->keys[0].value;

    if (scale_x) scaling.x = scale_x->keys[0].value;
    if (scale_y) scaling.y = scale_y->keys[0].value;
    if (scale_z) scaling.z = scale_z->keys[0].value;

    // build the final matrix
    aiMatrix4x4 s,rx,ry,rz,t;
    aiMatrix4x4::RotationZ(angles.z, rz);
    aiMatrix4x4::RotationX(angles.y, rx);
    aiMatrix4x4::RotationY(angles.x, ry);
    aiMatrix4x4::Translation(translation,t);
    aiMatrix4x4::Scaling(scaling,s);
    out = t*ry*rx*rz*s;
}